

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O2

void __thiscall
GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner(GeneralizedMAAStarPlanner *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

GeneralizedMAAStarPlanner::~GeneralizedMAAStarPlanner()
{
}